

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_2;
  SyntaxNode *args_4;
  ProceduralAssignStatementSyntax *pPVar1;
  DeepCloneVisitor visitor;
  DeepCloneVisitor visitor_1;
  NamedLabelSyntax *local_58;
  Token local_50;
  Token local_40;
  
  if (*(SyntaxNode **)(__fn + 0x18) == (SyntaxNode *)0x0) {
    local_58 = (NamedLabelSyntax *)0x0;
  }
  else {
    local_58 = (NamedLabelSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x18),(DeepCloneVisitor *)&local_50,
                          (BumpAllocator *)__child_stack);
  }
  args_2 = deepClone<slang::syntax::AttributeInstanceSyntax>
                     ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x20),
                      (BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x58),(BumpAllocator *)__child_stack);
  args_4 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x68),(DeepCloneVisitor *)&local_40,
                      (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x70),(BumpAllocator *)__child_stack);
  pPVar1 = BumpAllocator::
           emplace<slang::syntax::ProceduralAssignStatementSyntax,slang::syntax::SyntaxKind_const&,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,(SyntaxKind *)__fn,&local_58,args_2,&local_50,
                      (ExpressionSyntax *)args_4,&local_40);
  return (int)pPVar1;
}

Assistant:

static SyntaxNode* clone(const ProceduralAssignStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ProceduralAssignStatementSyntax>(
        node.kind,
        node.label ? deepClone(*node.label, alloc) : nullptr,
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.expr, alloc),
        node.semi.deepClone(alloc)
    );
}